

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_class_override_bases(writer *w,TypeDef *type)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  TypeDef *local_50;
  TypeDef *base;
  iterator __end1;
  iterator __begin1;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *__range1;
  TypeDef *type_local;
  writer *w_local;
  
  get_bases((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)&__begin1,
            type);
  __end1 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::begin
                     ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                      &__begin1);
  base = (TypeDef *)
         std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::end
                   ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                    &__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                                *)&base);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
               ::operator*(&__end1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,", %");
    writer_base<cppwinrt::writer>::write<winmd::reader::TypeDef>
              (&w->super_writer_base<cppwinrt::writer>,&local_60,local_50);
    __gnu_cxx::
    __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
    ::operator++(&__end1);
  }
  std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::~vector
            ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)&__begin1);
  return;
}

Assistant:

static void write_class_override_bases(writer& w, TypeDef const& type)
    {
        for (auto&& base : get_bases(type))
        {
            w.write(", %", base);
        }
    }